

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# anim_encode.c
# Opt level: O1

int FlushFrames(WebPAnimEncoder *enc)

{
  size_t sVar1;
  WebPMuxError WVar2;
  long lVar3;
  EncodedFrame *pEVar4;
  undefined8 *puVar5;
  EncodedFrame *pEVar6;
  int iVar7;
  byte bVar8;
  EncodedFrame temp;
  undefined8 auStack_98 [13];
  
  bVar8 = 0;
  while (enc->flush_count_ != 0) {
    sVar1 = enc->start_;
    pEVar6 = enc->encoded_frames_;
    pEVar4 = pEVar6 + sVar1;
    if (pEVar6[sVar1].is_key_frame_ != 0) {
      pEVar4 = (EncodedFrame *)&pEVar6[sVar1].key_frame_;
    }
    WVar2 = WebPMuxPushFrame(enc->mux_,&pEVar4->sub_frame_,1);
    if (WVar2 == WEBP_MUX_OK) {
      if ((enc->options_).verbose != 0) {
        FlushFrames_cold_1();
      }
      enc->out_frame_count_ = enc->out_frame_count_ + 1;
      FrameRelease(pEVar6 + sVar1);
      enc->flush_count_ = enc->flush_count_ - 1;
      enc->start_ = enc->start_ + 1;
      enc->count_ = enc->count_ - 1;
      if (enc->keyframe_ != -1) {
        enc->keyframe_ = enc->keyframe_ + -1;
      }
    }
    else {
      snprintf(enc->error_str_,100,"%s: %d.","ERROR adding frame. WebPMuxError",(ulong)(uint)WVar2);
    }
    if (WVar2 != WEBP_MUX_OK) {
      return 0;
    }
  }
  if (enc->count_ != 1) {
    return 1;
  }
  sVar1 = enc->start_;
  if (sVar1 == 0) {
    return 1;
  }
  pEVar6 = enc->encoded_frames_;
  pEVar4 = pEVar6;
  puVar5 = auStack_98;
  for (lVar3 = 0xd; lVar3 != 0; lVar3 = lVar3 + -1) {
    *puVar5 = (pEVar4->sub_frame_).bitstream.bytes;
    pEVar4 = (EncodedFrame *)((long)pEVar4 + (ulong)bVar8 * -0x10 + 8);
    puVar5 = puVar5 + (ulong)bVar8 * -2 + 1;
  }
  iVar7 = (int)sVar1;
  pEVar4 = pEVar6 + iVar7;
  for (lVar3 = 0xd; lVar3 != 0; lVar3 = lVar3 + -1) {
    (pEVar6->sub_frame_).bitstream.bytes = (pEVar4->sub_frame_).bitstream.bytes;
    pEVar4 = (EncodedFrame *)((long)pEVar4 + (ulong)bVar8 * -0x10 + 8);
    pEVar6 = (EncodedFrame *)((long)pEVar6 + (ulong)bVar8 * -0x10 + 8);
  }
  puVar5 = auStack_98;
  pEVar6 = enc->encoded_frames_ + iVar7;
  for (lVar3 = 0xd; lVar3 != 0; lVar3 = lVar3 + -1) {
    (pEVar6->sub_frame_).bitstream.bytes = (uint8_t *)*puVar5;
    puVar5 = puVar5 + (ulong)bVar8 * -2 + 1;
    pEVar6 = (EncodedFrame *)((long)pEVar6 + (ulong)bVar8 * -0x10 + 8);
  }
  FrameRelease(enc->encoded_frames_ + iVar7);
  enc->start_ = 0;
  return 1;
}

Assistant:

static int FlushFrames(WebPAnimEncoder* const enc) {
  while (enc->flush_count_ > 0) {
    WebPMuxError err;
    EncodedFrame* const curr = GetFrame(enc, 0);
    const WebPMuxFrameInfo* const info =
        curr->is_key_frame_ ? &curr->key_frame_ : &curr->sub_frame_;
    assert(enc->mux_ != NULL);
    err = WebPMuxPushFrame(enc->mux_, info, 1);
    if (err != WEBP_MUX_OK) {
      MarkError2(enc, "ERROR adding frame. WebPMuxError", err);
      return 0;
    }
    if (enc->options_.verbose) {
      fprintf(stderr, "INFO: Added frame. offset:%d,%d dispose:%d blend:%d\n",
              info->x_offset, info->y_offset, info->dispose_method,
              info->blend_method);
    }
    ++enc->out_frame_count_;
    FrameRelease(curr);
    ++enc->start_;
    --enc->flush_count_;
    --enc->count_;
    if (enc->keyframe_ != KEYFRAME_NONE) --enc->keyframe_;
  }

  if (enc->count_ == 1 && enc->start_ != 0) {
    // Move enc->start to index 0.
    const int enc_start_tmp = (int)enc->start_;
    EncodedFrame temp = enc->encoded_frames_[0];
    enc->encoded_frames_[0] = enc->encoded_frames_[enc_start_tmp];
    enc->encoded_frames_[enc_start_tmp] = temp;
    FrameRelease(&enc->encoded_frames_[enc_start_tmp]);
    enc->start_ = 0;
  }
  return 1;
}